

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_1::getVectorsFromComps(Functions *gl,deUint32 pname)

{
  GLenum err;
  long *plVar1;
  TestError *this;
  size_type *psVar2;
  long *plVar3;
  int value;
  long *local_a8;
  long local_98;
  long lStack_90;
  uint local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  code *local_40;
  deUint32 local_38;
  
  local_84 = 0xffffffff;
  (*gl->getIntegerv)(pname,(GLint *)&local_84);
  err = (*gl->getError)();
  local_40 = glu::getGettableStateName;
  local_38 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1afca74);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_80.field_2._M_allocated_capacity = *psVar2;
    local_80.field_2._8_8_ = plVar1[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar2;
    local_80._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_80._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_98 = *plVar3;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar3;
    local_a8 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  glu::checkError(err,(char *)local_a8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x41);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((local_84 & 3) == 0) {
    return (int)local_84 >> 2;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  local_40 = glu::getGettableStateName;
  local_38 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
  std::operator+(&local_80,"Expected ",&local_60);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_a8 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_a8 == plVar3) {
    local_98 = *plVar3;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar3;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  tcu::TestError::TestError
            (this,(char *)local_a8,"value%4 == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0x42);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static int getVectorsFromComps (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	TCU_CHECK_MSG(value%4 == 0, ("Expected " + glu::getGettableStateStr((int)pname).toString() + " to be divisible by 4").c_str());
	return value/4;
}